

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O0

void __thiscall
Js::JavascriptArray::ArrayElementEnumerator::Init(ArrayElementEnumerator *this,JavascriptArray *arr)

{
  bool bVar1;
  SparseArraySegmentBase **ppSVar2;
  uint *puVar3;
  SparseArraySegmentBase *local_30;
  uint local_1c;
  JavascriptArray *local_18;
  JavascriptArray *arr_local;
  ArrayElementEnumerator *this_local;
  
  local_18 = arr;
  arr_local = (JavascriptArray *)this;
  if (arr == (JavascriptArray *)0x0) {
    local_30 = (SparseArraySegmentBase *)0x0;
  }
  else {
    local_30 = GetBeginLookupSegment(arr,this->start,true);
  }
  this->seg = local_30;
  while( true ) {
    bVar1 = false;
    if (this->seg != (SparseArraySegmentBase *)0x0) {
      bVar1 = this->seg->left + this->seg->length <= this->start;
    }
    if (!bVar1) break;
    ppSVar2 = Memory::WriteBarrierPtr::operator_cast_to_SparseArraySegmentBase__
                        ((WriteBarrierPtr *)&this->seg->next);
    this->seg = *ppSVar2;
  }
  if (this->seg != (SparseArraySegmentBase *)0x0) {
    if (this->seg->left < this->end) {
      puVar3 = max<unsigned_int>(&this->seg->left,&this->start);
      this->index = (*puVar3 - this->seg->left) - 1;
      local_1c = this->end - this->seg->left;
      puVar3 = min<unsigned_int>(&local_1c,&this->seg->length);
      this->endIndex = *puVar3;
    }
    else {
      this->seg = (SparseArraySegmentBase *)0x0;
    }
  }
  return;
}

Assistant:

void JavascriptArray::ArrayElementEnumerator::Init(JavascriptArray* arr)
    {
        // Find start segment
        seg = (arr ? arr->GetBeginLookupSegment(start) : nullptr);
        while (seg && (seg->left + seg->length <= start))
        {
            seg = seg->next;
        }

        // Set start index and endIndex
        if (seg)
        {
            if (seg->left >= end)
            {
                seg = nullptr;
            }
            else
            {
                // set index to be at target index - 1, so MoveNext will move to target
                index = max(seg->left, start) - seg->left - 1;
                endIndex = min(end - seg->left, seg->length);
            }
        }
    }